

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

int __thiscall
roaring::Roaring64Map::select
          (Roaring64Map *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  bool bVar1;
  uint uVar2;
  undefined7 extraout_var;
  fd_set *pfVar3;
  runtime_error *this_00;
  uint64_t uVar4;
  undefined4 in_register_00000034;
  uint32_t low_bytes;
  uint64_t sub_cardinality;
  Roaring *bitmap;
  uint key;
  pair<const_unsigned_int,_roaring::Roaring> *map_entry;
  const_iterator __end2;
  const_iterator __begin2;
  roarings_t *__range2;
  map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  *in_stack_ffffffffffffff88;
  Roaring *in_stack_ffffffffffffff90;
  uint32_t local_5c;
  fd_set *local_58;
  Roaring *local_50;
  uint local_44;
  reference local_40;
  const_iterator local_38;
  const_iterator local_30;
  Roaring64Map *local_28;
  fd_set *local_20;
  fd_set *local_18;
  Roaring64Map *local_10;
  undefined1 local_1;
  
  local_18 = (fd_set *)CONCAT44(in_register_00000034,__nfds);
  local_28 = this;
  local_20 = __readfds;
  local_10 = this;
  local_30 = std::
             map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
             ::begin(in_stack_ffffffffffffff88);
  local_38 = std::
             map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
             ::end(in_stack_ffffffffffffff88);
  do {
    bVar1 = std::operator!=(&stack0xffffffffffffffd0,&stack0xffffffffffffffc8);
    if (!bVar1) {
      local_1 = 0;
      local_20 = (fd_set *)CONCAT71(extraout_var,bVar1);
LAB_0010c51b:
      return (int)CONCAT71((int7)((ulong)local_20 >> 8),local_1);
    }
    local_40 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
               operator*((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>
                          *)0x10c42d);
    local_44 = local_40->first;
    local_50 = &local_40->second;
    pfVar3 = (fd_set *)Roaring::cardinality(in_stack_ffffffffffffff90);
    local_58 = pfVar3;
    if (local_18 < pfVar3) {
      uVar2 = Roaring::select(local_50,(int)local_18,(fd_set *)&stack0xffffffffffffffa4,__writefds,
                              __exceptfds,__timeout);
      if ((uVar2 & 1) == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,
                   "Logic error: bitmap.select() returned false despite rank < cardinality()");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar4 = uniteBytes(local_44,local_5c);
      local_20->fds_bits[0] = uVar4;
      local_1 = 1;
      goto LAB_0010c51b;
    }
    local_18 = (fd_set *)((long)local_18 - (long)pfVar3);
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
               in_stack_ffffffffffffff90);
    __writefds = pfVar3;
  } while( true );
}

Assistant:

bool select(uint64_t rank, uint64_t *element) const {
        for (const auto &map_entry : roarings) {
            auto key = map_entry.first;
            const auto &bitmap = map_entry.second;

            uint64_t sub_cardinality = bitmap.cardinality();
            if (rank < sub_cardinality) {
                uint32_t low_bytes;
                // Casting rank to uint32_t is safe because
                // rank < sub_cardinality and sub_cardinality <= 2^32.
                if (!bitmap.select((uint32_t)rank, &low_bytes)) {
                    ROARING_TERMINATE(
                        "Logic error: bitmap.select() "
                        "returned false despite rank < cardinality()");
                }
                *element = uniteBytes(key, low_bytes);
                return true;
            }
            rank -= sub_cardinality;
        }
        return false;
    }